

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

pcut_item_t * pcut_get_real_next(pcut_item_t *item)

{
  if (item != (pcut_item_t *)0x0) {
    while( true ) {
      item = item->next;
      if (item == (pcut_item_t *)0x0) break;
      if (item->kind != 0) {
        return item;
      }
    }
  }
  return (pcut_item_t *)0x0;
}

Assistant:

pcut_item_t *pcut_get_real_next(pcut_item_t *item) {
	if (item == NULL) {
		return NULL;
	}

	do {
		item = item->next;
	} while ((item != NULL) && (item->kind == PCUT_KIND_SKIP));


	return item;
}